

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_outputs_tests.cpp
# Opt level: O0

void __thiscall
wallet::group_outputs_tests::GroupVerifier::GroupVerify
          (GroupVerifier *this,OutputType type,CoinEligibilityFilter *filter,
          bool avoid_partial_spends,bool positive_only,int expected_size)

{
  initializer_list<wallet::SelectionFilter> __l;
  undefined8 *in_RDX;
  byte in_R8B;
  long in_FS_OFFSET;
  vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *groups_out;
  OutputGroupTypeMap groups;
  char *in_stack_fffffffffffffd98;
  lazy_ostream *in_stack_fffffffffffffda0;
  char *in_stack_fffffffffffffda8;
  OutputGroupTypeMap *in_stack_fffffffffffffdb0;
  OutputGroupTypeMap *in_stack_fffffffffffffdb8;
  undefined7 in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffdc7;
  CoinSelectionParams *in_stack_fffffffffffffdc8;
  CoinsResult *in_stack_fffffffffffffdd0;
  const_string *file;
  CWallet *in_stack_fffffffffffffdd8;
  undefined7 in_stack_fffffffffffffde0;
  undefined1 in_stack_fffffffffffffde7;
  FastRandomContext *in_stack_fffffffffffffde8;
  size_type local_1a0;
  undefined1 local_198 [16];
  undefined1 local_188 [96];
  lazy_ostream local_128 [6];
  undefined8 local_c8;
  undefined1 uStack_c0;
  undefined7 local_bf;
  undefined1 uStack_b8;
  undefined8 uStack_b7;
  undefined1 local_a8;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffffda8);
  makeSelectionParams(in_stack_fffffffffffffde8,(bool)in_stack_fffffffffffffde7);
  local_c8 = *in_RDX;
  uStack_b7 = *(undefined8 *)((long)in_RDX + 0x11);
  uStack_b8 = (undefined1)((ulong)*(undefined8 *)((long)in_RDX + 9) >> 0x38);
  uStack_c0 = (undefined1)in_RDX[1];
  local_bf = (undefined7)((ulong)in_RDX[1] >> 8);
  local_a8 = 1;
  std::allocator<wallet::SelectionFilter>::allocator
            ((allocator<wallet::SelectionFilter> *)in_stack_fffffffffffffd98);
  __l._M_array._7_1_ = in_stack_fffffffffffffde7;
  __l._M_array._0_7_ = in_stack_fffffffffffffde0;
  __l._M_len = (size_type)in_stack_fffffffffffffde8;
  std::vector<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>::vector
            ((vector<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_> *)
             in_stack_fffffffffffffdd8,__l,(allocator_type *)in_stack_fffffffffffffdd0);
  GroupOutputs(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
               (vector<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_> *)
               CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0));
  std::
  map<wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap,_std::less<wallet::CoinEligibilityFilter>,_std::allocator<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>_>
  ::operator[]((map<wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap,_std::less<wallet::CoinEligibilityFilter>,_std::allocator<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>_>
                *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
               (key_type *)in_stack_fffffffffffffdb8);
  OutputGroupTypeMap::OutputGroupTypeMap(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  std::
  map<wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap,_std::less<wallet::CoinEligibilityFilter>,_std::allocator<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>_>
  ::~map((map<wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap,_std::less<wallet::CoinEligibilityFilter>,_std::allocator<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>_>
          *)in_stack_fffffffffffffd98);
  std::vector<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>::~vector
            ((vector<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_> *)
             in_stack_fffffffffffffda8);
  std::allocator<wallet::SelectionFilter>::~allocator
            ((allocator<wallet::SelectionFilter> *)in_stack_fffffffffffffd98);
  if ((in_R8B & 1) == 0) {
    in_stack_fffffffffffffdd8 =
         (CWallet *)
         std::
         map<OutputType,_wallet::Groups,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::Groups>_>_>
         ::operator[]((map<OutputType,_wallet::Groups,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::Groups>_>_>
                       *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                      (key_type *)in_stack_fffffffffffffdb8);
  }
  else {
    std::
    map<OutputType,_wallet::Groups,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::Groups>_>_>
    ::operator[]((map<OutputType,_wallet::Groups,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::Groups>_>_>
                  *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                 (key_type *)in_stack_fffffffffffffdb8);
  }
  do {
    file = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffda8,
               (pointer)in_stack_fffffffffffffda0,(unsigned_long)in_stack_fffffffffffffd98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffdd8,file,(size_t)in_stack_fffffffffffffdc8,
               (const_string *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0));
    in_stack_fffffffffffffdc8 = (CoinSelectionParams *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffda0,(char (*) [1])in_stack_fffffffffffffd98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffda8,
               (pointer)in_stack_fffffffffffffda0,(unsigned_long)in_stack_fffffffffffffd98);
    local_1a0 = std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::size
                          ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
                           in_stack_fffffffffffffd98);
    in_stack_fffffffffffffda8 = "expected_size";
    in_stack_fffffffffffffda0 = local_128;
    in_stack_fffffffffffffd98 = "groups_out.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (local_188,local_198,0x5d,1,2,&local_1a0);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffd98);
    in_stack_fffffffffffffdc7 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffdc7);
  OutputGroupTypeMap::~OutputGroupTypeMap((OutputGroupTypeMap *)in_stack_fffffffffffffd98);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void GroupVerify(const OutputType type,
                     const CoinEligibilityFilter& filter,
                     bool avoid_partial_spends,
                     bool positive_only,
                     int expected_size)
    {
        OutputGroupTypeMap groups = GroupOutputs(*wallet, coins_pool, makeSelectionParams(rand, avoid_partial_spends), {{filter}})[filter];
        std::vector<OutputGroup>& groups_out = positive_only ? groups.groups_by_type[type].positive_group :
                                               groups.groups_by_type[type].mixed_group;
        BOOST_CHECK_EQUAL(groups_out.size(), expected_size);
    }